

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_vnum(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *argument_00;
  char arg [4608];
  char local_1228 [4616];
  
  argument_00 = one_argument(argument,local_1228);
  if (local_1228[0] == '\0') {
    send_to_char("Syntax:\n\r",ch);
    send_to_char("  vnum obj <name>\n\r",ch);
    send_to_char("  vnum mob <name>\n\r",ch);
    send_to_char("  vnum skill <skill or spell>\n\r",ch);
    return;
  }
  bVar1 = str_cmp(local_1228,"obj");
  if (bVar1) {
    bVar1 = str_cmp(local_1228,"mob");
    if ((!bVar1) || (bVar1 = str_cmp(local_1228,"char"), !bVar1)) {
      do_mfind(ch,argument_00);
      return;
    }
    bVar1 = str_cmp(local_1228,"skill");
    if ((!bVar1) || (bVar1 = str_cmp(local_1228,"spell"), !bVar1)) {
      do_slookup(ch,argument_00);
      return;
    }
    do_mfind(ch,argument);
    argument_00 = argument;
  }
  do_ofind(ch,argument_00);
  return;
}

Assistant:

void do_vnum(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	char *string;

	string = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  vnum obj <name>\n\r", ch);
		send_to_char("  vnum mob <name>\n\r", ch);
		send_to_char("  vnum skill <skill or spell>\n\r", ch);
		return;
	}

	if (!str_cmp(arg, "obj"))
	{
		do_ofind(ch, string);
		return;
	}

	if (!str_cmp(arg, "mob") || !str_cmp(arg, "char"))
	{
		do_mfind(ch, string);
		return;
	}

	if (!str_cmp(arg, "skill") || !str_cmp(arg, "spell"))
	{
		do_slookup(ch, string);
		return;
	}

	/* do both */
	do_mfind(ch, argument);
	do_ofind(ch, argument);
}